

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O2

JL_STATUS JlBase64Encode(void *Data,size_t DataSize,char **pBase64String)

{
  JL_STATUS JVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *FourCharBlock;
  uint8_t *ThreeByteBlock;
  uint8_t byteBlock [3];
  char charBlock [4];
  
  if (pBase64String == (char **)0x0 || (DataSize == 0 || Data == (void *)0x0)) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  *pBase64String = (char *)0x0;
  uVar2 = DataSize / 3;
  uVar6 = DataSize % 3;
  lVar3 = uVar6 + 1;
  if (uVar6 == 0) {
    lVar3 = 0;
  }
  pcVar4 = (char *)WjTestLib_Calloc(lVar3 + uVar2 * 4 + 1,1);
  uVar5 = uVar2;
  FourCharBlock = pcVar4;
  ThreeByteBlock = (uint8_t *)Data;
  if (pcVar4 == (char *)0x0) {
    JVar1 = JL_STATUS_OUT_OF_MEMORY;
  }
  else {
    while (uVar5 != 0) {
      Encode3BytesToBase64(ThreeByteBlock,FourCharBlock);
      uVar5 = uVar5 - 1;
      FourCharBlock = FourCharBlock + 4;
      ThreeByteBlock = ThreeByteBlock + 3;
    }
    if (uVar6 != 0) {
      byteBlock[0] = '\0';
      byteBlock[1] = '\0';
      charBlock[0] = '\0';
      charBlock[1] = '\0';
      charBlock[2] = '\0';
      charBlock[3] = '\0';
      byteBlock[2] = '\0';
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        byteBlock[uVar5] = *(uint8_t *)((long)Data + uVar5 + uVar2 * 3);
      }
      Encode3BytesToBase64(byteBlock,charBlock);
      for (uVar2 = 0; uVar2 <= uVar6; uVar2 = uVar2 + 1) {
        FourCharBlock[uVar2] = charBlock[uVar2];
      }
    }
    *pBase64String = pcVar4;
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlBase64Encode
    (
        void const*         Data,
        size_t              DataSize,
        char**              pBase64String
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Data
        &&  0 != DataSize
        &&  NULL != pBase64String )
    {
        uint8_t const* dataBytes = Data;
        *pBase64String = NULL;

        size_t numCompleteBlocks = DataSize / 3;
        size_t numTrailingBytes = DataSize % 3;
        size_t numExtraChars = 0;

        // Calculate size of string needed
        size_t stringLength = numCompleteBlocks * 4;
        if( numTrailingBytes > 0 )
        {
            numExtraChars = numTrailingBytes + 1;
            stringLength += numExtraChars;
        }

        // Allocate string (one larger for the zero terminator)
        char* string = JlAlloc( stringLength + 1 );
        if( NULL != string )
        {
            // Process in blocks of 3 input bytes at a time
            size_t outIndex = 0;
            for( size_t blockIndex=0; blockIndex<numCompleteBlocks; blockIndex+=1 )
            {
                Encode3BytesToBase64( dataBytes + (blockIndex*3), string + outIndex );
                outIndex += 4;
            }

            if( numTrailingBytes > 0 )
            {
                // Process the final partial block
                uint8_t byteBlock[3] = {0};
                char charBlock[4] = {0};
                for( size_t i=0; i<numTrailingBytes; i++ )
                {
                    byteBlock[i] = dataBytes[ (numCompleteBlocks*3) + i ];
                }
                Encode3BytesToBase64( byteBlock, charBlock );

                // Now copy out the required number of characters
                for( size_t i=0; i<numExtraChars; i++ )
                {
                    string[outIndex] = charBlock[i];
                    outIndex += 1;
                }
            }

            *pBase64String = string;

            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}